

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_8::DiskHandle::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  size_t sVar1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  Maybe<kj::FsNode::Metadata> *extraout_RAX;
  char *pcVar5;
  Fault f;
  stat stats;
  String local_e8;
  stat local_d0;
  PathPtr local_40;
  Maybe<kj::FsNode::Metadata> *pMVar4;
  
  local_40.parts.size_ = path.parts.size_;
  local_40.parts.ptr = path.parts.ptr;
  do {
    iVar2 = (this->fd).fd;
    PathPtr::toString(&local_e8,&local_40,false);
    pcVar5 = "";
    if (local_e8.content.size_ != 0) {
      pcVar5 = local_e8.content.ptr;
    }
    iVar2 = fstatat(iVar2,pcVar5,&local_d0,0x100);
    sVar1 = local_e8.content.size_;
    pcVar5 = local_e8.content.ptr;
    if (local_e8.content.ptr != (char *)0x0) {
      local_e8.content.ptr = (char *)0x0;
      local_e8.content.size_ = 0;
      (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
                (local_e8.content.disposer,pcVar5,1,sVar1,sVar1,0);
    }
    if (-1 < iVar2) goto LAB_0024ad0d;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
LAB_0024ad0d:
    TVar3 = modeToType(local_d0.st_mode);
    pMVar4 = (Maybe<kj::FsNode::Metadata> *)CONCAT44(extraout_var,TVar3);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.type = TVar3;
    (__return_storage_ptr__->ptr).field_1.value.size = local_d0.st_size;
    (__return_storage_ptr__->ptr).field_1.value.spaceUsed = local_d0.st_blocks << 9;
    (__return_storage_ptr__->ptr).field_1.value.lastModified.value.value =
         local_d0.st_mtim.tv_sec * 1000000000 + local_d0.st_mtim.tv_nsec;
    (__return_storage_ptr__->ptr).field_1.value.linkCount = (uint)local_d0.st_nlink;
    (__return_storage_ptr__->ptr).field_1.value.hashCode =
         (local_d0.st_dev << 0x20 | local_d0.st_dev >> 0x20) ^ local_d0.st_ino;
  }
  else if ((iVar2 == 0x14) || (iVar2 == 2)) {
    (__return_storage_ptr__->ptr).isSet = false;
    pMVar4 = __return_storage_ptr__;
  }
  else {
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2dc,iVar2,"faccessat(fd, path)","path",&local_40);
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault((Fault *)&local_e8);
    pMVar4 = extraout_RAX;
  }
  return pMVar4;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const {
    struct stat stats;
    KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.toString().cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
      case ENOENT:
      case ENOTDIR:
        return nullptr;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return nullptr; }
    }
    return statToMetadata(stats);
  }